

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O2

void __thiscall
embree::ThinDielectricMaterial::ThinDielectricMaterial
          (ThinDielectricMaterial *this,Vec3fa *transmission,float eta,float thickness)

{
  undefined8 uVar1;
  float fVar2;
  allocator local_6d;
  float local_6c;
  float local_68;
  float local_58;
  float local_48;
  string local_38;
  
  local_6c = eta;
  local_48 = thickness;
  std::__cxx11::string::string((string *)&local_38,"",&local_6d);
  SceneGraph::MaterialNode::MaterialNode(&this->super_MaterialNode,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__Node_002a9010;
  (this->base).type = 1;
  uVar1 = *(undefined8 *)((long)&transmission->field_0 + 8);
  *(undefined8 *)&(this->transmission).field_0 = *(undefined8 *)&transmission->field_0;
  *(undefined8 *)((long)&(this->transmission).field_0 + 8) = uVar1;
  local_58 = logf((transmission->field_0).m128[0]);
  local_68 = logf((transmission->field_0).m128[1]);
  fVar2 = logf((transmission->field_0).m128[2]);
  (this->transmissionFactor).field_0.m128[0] = local_48 * local_58;
  (this->transmissionFactor).field_0.m128[1] = local_48 * local_68;
  (this->transmissionFactor).field_0.m128[2] = local_48 * fVar2;
  (this->transmissionFactor).field_0.m128[3] = local_48 * 0.0;
  this->eta = local_6c;
  this->thickness = local_48;
  return;
}

Assistant:

ThinDielectricMaterial (const Vec3fa& transmission, const float eta, const float thickness)
      : base(MATERIAL_THIN_DIELECTRIC), transmission(transmission), transmissionFactor(log(transmission)*thickness), eta(eta), thickness(thickness) {}